

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O3

int mbedtls_md_starts(mbedtls_md_context_t *ctx)

{
  int iVar1;
  
  if ((ctx != (mbedtls_md_context_t *)0x0) && (ctx->md_info != (mbedtls_md_info_t *)0x0)) {
    switch(ctx->md_info->type) {
    case MBEDTLS_MD_MD5:
      iVar1 = mbedtls_md5_starts_ret((mbedtls_md5_context *)ctx->md_ctx);
      return iVar1;
    case MBEDTLS_MD_SHA1:
      iVar1 = mbedtls_sha1_starts_ret((mbedtls_sha1_context *)ctx->md_ctx);
      return iVar1;
    case MBEDTLS_MD_SHA224:
      iVar1 = mbedtls_sha256_starts_ret((mbedtls_sha256_context *)ctx->md_ctx,1);
      return iVar1;
    case MBEDTLS_MD_SHA256:
      iVar1 = mbedtls_sha256_starts_ret((mbedtls_sha256_context *)ctx->md_ctx,0);
      return iVar1;
    case MBEDTLS_MD_SHA384:
      iVar1 = mbedtls_sha512_starts_ret((mbedtls_sha512_context *)ctx->md_ctx,1);
      return iVar1;
    case MBEDTLS_MD_SHA512:
      iVar1 = mbedtls_sha512_starts_ret((mbedtls_sha512_context *)ctx->md_ctx,0);
      return iVar1;
    case MBEDTLS_MD_RIPEMD160:
      iVar1 = mbedtls_ripemd160_starts_ret((mbedtls_ripemd160_context *)ctx->md_ctx);
      return iVar1;
    }
  }
  return -0x5100;
}

Assistant:

int mbedtls_md_starts( mbedtls_md_context_t *ctx )
{
    if( ctx == NULL || ctx->md_info == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    switch( ctx->md_info->type )
    {
#if defined(MBEDTLS_MD2_C)
        case MBEDTLS_MD_MD2:
            return( mbedtls_md2_starts_ret( ctx->md_ctx ) );
#endif
#if defined(MBEDTLS_MD4_C)
        case MBEDTLS_MD_MD4:
            return( mbedtls_md4_starts_ret( ctx->md_ctx ) );
#endif
#if defined(MBEDTLS_MD5_C)
        case MBEDTLS_MD_MD5:
            return( mbedtls_md5_starts_ret( ctx->md_ctx ) );
#endif
#if defined(MBEDTLS_RIPEMD160_C)
        case MBEDTLS_MD_RIPEMD160:
            return( mbedtls_ripemd160_starts_ret( ctx->md_ctx ) );
#endif
#if defined(MBEDTLS_SHA1_C)
        case MBEDTLS_MD_SHA1:
            return( mbedtls_sha1_starts_ret( ctx->md_ctx ) );
#endif
#if defined(MBEDTLS_SHA256_C)
        case MBEDTLS_MD_SHA224:
            return( mbedtls_sha256_starts_ret( ctx->md_ctx, 1 ) );
        case MBEDTLS_MD_SHA256:
            return( mbedtls_sha256_starts_ret( ctx->md_ctx, 0 ) );
#endif
#if defined(MBEDTLS_SHA512_C)
#if !defined(MBEDTLS_SHA512_NO_SHA384)
        case MBEDTLS_MD_SHA384:
            return( mbedtls_sha512_starts_ret( ctx->md_ctx, 1 ) );
#endif
        case MBEDTLS_MD_SHA512:
            return( mbedtls_sha512_starts_ret( ctx->md_ctx, 0 ) );
#endif
        default:
            return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );
    }
}